

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O0

container_t *
container_add_range(container_t *c,uint8_t type,uint32_t min,uint32_t max,uint8_t *result_type)

{
  int iVar1;
  int iVar2;
  int32_t iVar3;
  int32_t iVar4;
  int in_ECX;
  uint32_t in_EDX;
  char in_SIL;
  run_container_t *in_RDI;
  undefined1 *in_R8;
  int32_t bitset_size_bytes;
  int32_t run_size_bytes;
  int32_t nruns_less;
  int32_t nruns_greater;
  run_container_t *run;
  bitset_container_t *bitset_1;
  int32_t union_cardinality_1;
  int32_t nvals_less;
  int32_t nvals_greater;
  array_container_t *array;
  int32_t union_cardinality;
  bitset_container_t *bitset;
  undefined2 in_stack_ffffffffffffff90;
  uint16_t in_stack_ffffffffffffff92;
  uint32_t in_stack_ffffffffffffff94;
  uint32_t in_stack_ffffffffffffff98;
  uint32_t in_stack_ffffffffffffff9c;
  array_container_t *in_stack_ffffffffffffffa0;
  uint8_t *in_stack_ffffffffffffffa8;
  uint32_t in_stack_ffffffffffffffb0;
  uint32_t in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  run_container_t *local_8;
  
  local_8 = in_RDI;
  if (in_SIL == '\x01') {
    iVar2 = in_RDI->n_runs;
    iVar1 = bitset_lenrange_cardinality
                      ((uint64_t *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                       in_stack_ffffffffffffff94,
                       CONCAT22(in_stack_ffffffffffffff92,in_stack_ffffffffffffff90));
    iVar1 = ((in_ECX - in_EDX) + 1 + iVar2) - iVar1;
    if (iVar1 == 0x10000) {
      *in_R8 = 3;
      local_8 = run_container_create_range
                          (in_stack_ffffffffffffff94,
                           CONCAT22(in_stack_ffffffffffffff92,in_stack_ffffffffffffff90));
    }
    else {
      *in_R8 = 1;
      bitset_set_lenrange((uint64_t *)in_RDI->runs,in_EDX,in_ECX - in_EDX);
      in_RDI->n_runs = iVar1;
    }
  }
  else if (in_SIL == '\x02') {
    iVar3 = count_greater((uint16_t *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                          in_stack_ffffffffffffff94,in_stack_ffffffffffffff92);
    iVar4 = count_less((uint16_t *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                       in_stack_ffffffffffffff94,in_stack_ffffffffffffff92);
    iVar2 = iVar4 + (in_ECX - in_EDX) + 1 + iVar3;
    if (iVar2 == 0x10000) {
      *in_R8 = 3;
      local_8 = run_container_create_range
                          (in_stack_ffffffffffffff94,
                           CONCAT22(in_stack_ffffffffffffff92,in_stack_ffffffffffffff90));
    }
    else if (iVar2 < 0x1001) {
      *in_R8 = 2;
      array_container_add_range_nvals
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98,
                 in_stack_ffffffffffffff94,
                 CONCAT22(in_stack_ffffffffffffff92,in_stack_ffffffffffffff90));
    }
    else {
      *in_R8 = 1;
      local_8 = (run_container_t *)
                bitset_container_from_array
                          ((array_container_t *)
                           CONCAT44(in_stack_ffffffffffffff94,
                                    CONCAT22(in_stack_ffffffffffffff92,in_stack_ffffffffffffff90)));
      bitset_set_lenrange((uint64_t *)local_8->runs,in_EDX,in_ECX - in_EDX);
      local_8->n_runs = iVar2;
    }
  }
  else {
    iVar3 = rle16_count_greater(in_RDI->runs,in_RDI->n_runs,(uint16_t)in_ECX);
    iVar4 = rle16_count_less(in_RDI->runs,in_RDI->n_runs - iVar3,(uint16_t)in_EDX);
    if ((iVar4 + 1 + iVar3) * 4 < 0x2001) {
      run_container_add_range_nruns
                ((run_container_t *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 (uint32_t)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                 (uint32_t)in_stack_ffffffffffffffa8,(int32_t)((ulong)in_RDI >> 0x20),
                 (int32_t)in_RDI);
      *in_R8 = 3;
      local_8 = in_RDI;
    }
    else {
      local_8 = (run_container_t *)
                container_from_run_range
                          ((run_container_t *)
                           CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                           in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,
                           in_stack_ffffffffffffffa8);
    }
  }
  return local_8;
}

Assistant:

static inline container_t *container_add_range(container_t *c, uint8_t type,
                                               uint32_t min, uint32_t max,
                                               uint8_t *result_type) {
    // NB: when selecting new container type, we perform only inexpensive checks
    switch (type) {
        case BITSET_CONTAINER_TYPE: {
            bitset_container_t *bitset = CAST_bitset(c);

            int32_t union_cardinality = 0;
            union_cardinality += bitset->cardinality;
            union_cardinality += max - min + 1;
            union_cardinality -=
                bitset_lenrange_cardinality(bitset->words, min, max - min);

            if (union_cardinality == INT32_C(0x10000)) {
                *result_type = RUN_CONTAINER_TYPE;
                return run_container_create_range(0, INT32_C(0x10000));
            } else {
                *result_type = BITSET_CONTAINER_TYPE;
                bitset_set_lenrange(bitset->words, min, max - min);
                bitset->cardinality = union_cardinality;
                return bitset;
            }
        }
        case ARRAY_CONTAINER_TYPE: {
            array_container_t *array = CAST_array(c);

            int32_t nvals_greater =
                count_greater(array->array, array->cardinality, (uint16_t)max);
            int32_t nvals_less =
                count_less(array->array, array->cardinality - nvals_greater,
                           (uint16_t)min);
            int32_t union_cardinality =
                nvals_less + (max - min + 1) + nvals_greater;

            if (union_cardinality == INT32_C(0x10000)) {
                *result_type = RUN_CONTAINER_TYPE;
                return run_container_create_range(0, INT32_C(0x10000));
            } else if (union_cardinality <= DEFAULT_MAX_SIZE) {
                *result_type = ARRAY_CONTAINER_TYPE;
                array_container_add_range_nvals(array, min, max, nvals_less,
                                                nvals_greater);
                return array;
            } else {
                *result_type = BITSET_CONTAINER_TYPE;
                bitset_container_t *bitset = bitset_container_from_array(array);
                bitset_set_lenrange(bitset->words, min, max - min);
                bitset->cardinality = union_cardinality;
                return bitset;
            }
        }
        case RUN_CONTAINER_TYPE: {
            run_container_t *run = CAST_run(c);

            int32_t nruns_greater =
                rle16_count_greater(run->runs, run->n_runs, (uint16_t)max);
            int32_t nruns_less = rle16_count_less(
                run->runs, run->n_runs - nruns_greater, (uint16_t)min);

            int32_t run_size_bytes =
                (nruns_less + 1 + nruns_greater) * sizeof(rle16_t);
            int32_t bitset_size_bytes =
                BITSET_CONTAINER_SIZE_IN_WORDS * sizeof(uint64_t);

            if (run_size_bytes <= bitset_size_bytes) {
                run_container_add_range_nruns(run, min, max, nruns_less,
                                              nruns_greater);
                *result_type = RUN_CONTAINER_TYPE;
                return run;
            } else {
                return container_from_run_range(run, min, max, result_type);
            }
        }
        default:
            roaring_unreachable;
    }
}